

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O0

void __thiscall QDialog::closeEvent(QDialog *this,QCloseEvent *e)

{
  long lVar1;
  bool bVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QEvent *pQVar3;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QPointer<QObject> that;
  QObject *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RSI;
  bVar2 = QWidget::isModal(in_RDI);
  __fd = (int)pQVar3;
  if ((bVar2) && (bVar2 = QWhatsThis::inWhatsThisMode(), bVar2)) {
    QWhatsThis::leaveWhatsThisMode();
  }
  bVar2 = QWidget::isVisible((QWidget *)0x7446cf);
  if (bVar2) {
    QPointer<QObject>::QPointer<void>((QPointer<QObject> *)in_RDI,in_stack_ffffffffffffffc8);
    (**(code **)(*(long *)in_RDI + 0x1c0))();
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QObject> *)0x744714);
    if ((bVar2) && (bVar2 = QWidget::isVisible((QWidget *)0x744724), bVar2)) {
      QEvent::ignore(in_RSI);
    }
    QPointer<QObject>::~QPointer((QPointer<QObject> *)0x74473e);
  }
  else {
    QEvent::accept(in_RSI,__fd,__addr,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialog::closeEvent(QCloseEvent *e)
{
#if QT_CONFIG(whatsthis)
    if (isModal() && QWhatsThis::inWhatsThisMode())
        QWhatsThis::leaveWhatsThisMode();
#endif
    if (isVisible()) {
        QPointer<QObject> that = this;
        reject();
        if (that && isVisible())
            e->ignore();
    } else {
        e->accept();
    }
}